

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O3

int Abc_GraphDeriveGia_rec
              (Gia_Man_t *p,int Lev,int Node,Vec_Wec_t *vNodes,int **pCache,int *pBuffer,
              Vec_Int_t *vEdges)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  int iVar4;
  int iData1;
  int iVar5;
  Gia_Obj_t *pGVar6;
  
  if (Node == -2) {
    iVar4 = 1;
  }
  else if (Node == -1) {
    iVar4 = 0;
  }
  else {
    iVar4 = pCache[Lev][Node];
    if (iVar4 == -1) {
      pBuffer[Lev] = 0;
      if ((-1 < Lev) && (Lev < vNodes->nSize)) {
        if (-1 < Node) {
          uVar3 = Node * 2;
          if ((int)uVar3 < vNodes->pArray[(uint)Lev].nSize) {
            iVar4 = Abc_GraphDeriveGia_rec
                              (p,Lev + 1,vNodes->pArray[(uint)Lev].pArray[uVar3],vNodes,pCache,
                               pBuffer,vEdges);
            pBuffer[Lev] = 1;
            if (vNodes->nSize <= Lev) goto LAB_004965ea;
            if ((int)(uVar3 | 1) < vNodes->pArray[(uint)Lev].nSize) {
              iData1 = Abc_GraphDeriveGia_rec
                                 (p,Lev + 1,vNodes->pArray[(uint)Lev].pArray[uVar3 | 1],vNodes,
                                  pCache,pBuffer,vEdges);
              if (Lev < p->vCis->nSize) {
                iVar1 = p->vCis->pArray[(uint)Lev];
                if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
                  __assert_fail("v >= 0 && v < p->nObjs",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
                }
                pGVar2 = p->pObjs;
                pGVar6 = (Gia_Obj_t *)((ulong)(pGVar2 + iVar1) & 0xfffffffffffffffe);
                if ((pGVar2 <= pGVar6) && (pGVar6 < pGVar2 + (uint)p->nObjs)) {
                  iVar5 = (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2);
                  if (-1 < iVar5 * -0x55555555) {
                    iVar4 = Gia_ManHashMux(p,((uint)(pGVar2 + iVar1) & 1) + iVar5 * 0x55555556,
                                           iData1,iVar4);
                    pCache[Lev][Node] = iVar4;
                    return iVar4;
                  }
                  __assert_fail("Var >= 0 && !(c >> 1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                ,0x12e,"int Abc_Var2Lit(int, int)");
                }
                __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                              ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
              }
            }
          }
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
LAB_004965ea:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
  }
  return iVar4;
}

Assistant:

int Abc_GraphDeriveGia_rec( Gia_Man_t * p, int Lev, int Node, Vec_Wec_t * vNodes, int ** pCache, int * pBuffer, Vec_Int_t * vEdges )
{
    int Res0, Res1;
    if ( Node == -2 )
        return 1;
    if ( Node == -1 )
        return 0;
    if ( pCache[Lev][Node] != -1 )
        return pCache[Lev][Node];
    pBuffer[Lev] = 0;
    Res0 = Abc_GraphDeriveGia_rec( p, Lev+1, Vec_IntEntry( Vec_WecEntry(vNodes, Lev), 2*Node   ), vNodes, pCache, pBuffer, vEdges );
    pBuffer[Lev] = 1;
    Res1 = Abc_GraphDeriveGia_rec( p, Lev+1, Vec_IntEntry( Vec_WecEntry(vNodes, Lev), 2*Node+1 ), vNodes, pCache, pBuffer, vEdges );
    return ( pCache[Lev][Node] = Gia_ManHashMux(p, Gia_Obj2Lit(p, Gia_ManCi(p, Lev)), Res1, Res0) );
}